

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

string * __thiscall
cmGlobalGenerator::GetSafeGlobalSetting
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *name)

{
  pointer ppcVar1;
  string *psVar2;
  
  ppcVar1 = (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppcVar1 !=
      (this->Makefiles).super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar2 = cmMakefile::GetSafeDefinition(*ppcVar1,name);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    return __return_storage_ptr__;
  }
  __assert_fail("!this->Makefiles.empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGlobalGenerator.cxx"
                ,0x4a2,
                "std::string cmGlobalGenerator::GetSafeGlobalSetting(const std::string &) const");
}

Assistant:

std::string cmGlobalGenerator::GetLanguageOutputExtension(
  cmSourceFile const& source) const
{
  const std::string& lang = source.GetLanguage();
  if (!lang.empty()) {
    auto const it = this->LanguageToOutputExtension.find(lang);
    if (it != this->LanguageToOutputExtension.end()) {
      return it->second;
    }
  } else {
    // if no language is found then check to see if it is already an
    // output extension for some language.  In that case it should be ignored
    // and in this map, so it will not be compiled but will just be used.
    std::string const& ext = source.GetExtension();
    if (!ext.empty()) {
      if (this->OutputExtensions.count(ext)) {
        return ext;
      }
    }
  }
  return "";
}